

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.c
# Opt level: O1

char * literal_get(EditLine *el,wint_t idx)

{
  if (-1 < (int)idx) {
    __assert_fail("idx & EL_LITERAL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ksherlock[P]libedit/src/literal.c"
                  ,0x86,"const char *literal_get(EditLine *, wint_t)");
  }
  if ((ulong)(idx & 0x7fffffff) < (el->el_literal).l_idx) {
    return (el->el_literal).l_buf[idx & 0x7fffffff];
  }
  __assert_fail("l->l_idx > (size_t)idx",
                "/workspace/llm4binary/github/license_c_cmakelists/ksherlock[P]libedit/src/literal.c"
                ,0x88,"const char *literal_get(EditLine *, wint_t)");
}

Assistant:

libedit_private const char *
literal_get(EditLine *el, wint_t idx)
{
	el_literal_t *l = &el->el_literal;

	assert(idx & EL_LITERAL);
	idx &= ~EL_LITERAL;
	assert(l->l_idx > (size_t)idx);
	return l->l_buf[idx];
}